

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.hpp
# Opt level: O1

void helics::fileops::replaceIfMember(value *element,string *key,string *loc)

{
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *v;
  value *element_00;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> val;
  value uval;
  undefined1 local_1d0 [32];
  basic_value<toml::type_config> local_1b0;
  basic_value<toml::type_config> local_e8;
  
  toml::basic_value<toml::type_config>::basic_value(&local_e8);
  v = toml::find_or<toml::type_config,std::__cxx11::string>(element,key,&local_e8);
  toml::basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)(local_1d0 + 0x20),v);
  if (local_1b0.type_ != '\0') {
    tomlAsString_abi_cxx11_((string *)local_1d0,(fileops *)(local_1d0 + 0x20),element_00);
    v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
        local_1d0;
    replaceIfMember();
  }
  toml::basic_value<toml::type_config>::cleanup
            ((basic_value<toml::type_config> *)(local_1d0 + 0x20),(EVP_PKEY_CTX *)v);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0.comments_.comments);
  toml::detail::region::~region(&local_1b0.region_);
  toml::basic_value<toml::type_config>::cleanup(&local_e8,(EVP_PKEY_CTX *)v);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8.comments_.comments);
  toml::detail::region::~region(&local_e8.region_);
  return;
}

Assistant:

inline void replaceIfMember(const toml::value& element, const std::string& key, std::string& loc)
{
    toml::value uval;
    auto val = toml::find_or(element, key, uval);

    if (!val.is_empty()) {
        loc = tomlAsString(val);
    }
}